

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void sarimax_setParams(sarimax_object obj,double *phi,double *theta,double *PHI,double *THETA)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  
  uVar1 = obj->p;
  if (phi == (double *)0x0) {
    if (0 < (int)uVar1) {
      memset(obj->phi,0,(ulong)uVar1 << 3);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar2 = obj->phi;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = phi[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  uVar1 = obj->q;
  if (theta == (double *)0x0) {
    if (0 < (int)uVar1) {
      memset(obj->theta,0,(ulong)uVar1 << 3);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar2 = obj->theta;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = theta[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  uVar1 = obj->P;
  if (PHI == (double *)0x0) {
    if (0 < (int)uVar1) {
      memset(obj->PHI,0,(ulong)uVar1 << 3);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar2 = obj->PHI;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = PHI[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  uVar1 = obj->Q;
  if (THETA == (double *)0x0) {
    if (0 < (int)uVar1) {
      memset(obj->THETA,0,(ulong)uVar1 << 3);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar2 = obj->THETA;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = THETA[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  obj->start = 1;
  return;
}

Assistant:

void sarimax_setParams(sarimax_object obj, double *phi, double *theta, double *PHI, double *THETA) {
	int i;
	if (phi) {
		for (i = 0; i < obj->p;++i) {
			obj->phi[i] = phi[i];
		}
	} else {
		for (i = 0; i < obj->p;++i) {
			obj->phi[i] = 0.0;
		}
	}

	if (theta) {
		for (i = 0; i < obj->q;++i) {
			obj->theta[i] = theta[i];
		}
	} else {
		for (i = 0; i < obj->q;++i) {
			obj->theta[i] = 0.0;
		}
	}

	if (PHI) {
		for (i = 0; i < obj->P;++i) {
			obj->PHI[i] = PHI[i];
		}
	} else {
		for (i = 0; i < obj->P;++i) {
			obj->PHI[i] = 0.0;
		}
	}

	if (THETA) {
		for (i = 0; i < obj->Q;++i) {
			obj->THETA[i] = THETA[i];
		}
	} else {
		for (i = 0; i < obj->Q;++i) {
			obj->THETA[i] = 0.0;
		}
	}

	obj->start = 1;
}